

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

TextureLevelPyramid * __thiscall
tcu::TextureLevelPyramid::operator=(TextureLevelPyramid *this,TextureLevelPyramid *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int depth;
  const_reference other_00;
  reference pvVar4;
  TextureFormat *format;
  void *data;
  reference __dest;
  PixelBufferAccess local_58;
  ConstPixelBufferAccess *local_30;
  ConstPixelBufferAccess *srcLevel;
  TextureLevelPyramid *pTStack_20;
  int levelNdx;
  TextureLevelPyramid *other_local;
  TextureLevelPyramid *this_local;
  
  if (this != other) {
    this->m_format = other->m_format;
    pTStack_20 = other;
    other_local = this;
    iVar2 = getNumLevels(other);
    std::
    vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
    ::resize(&this->m_data,(long)iVar2);
    iVar2 = getNumLevels(pTStack_20);
    std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::resize
              (&this->m_access,(long)iVar2);
    for (srcLevel._4_4_ = 0; iVar2 = srcLevel._4_4_, iVar3 = getNumLevels(pTStack_20), iVar2 < iVar3
        ; srcLevel._4_4_ = srcLevel._4_4_ + 1) {
      bVar1 = isLevelEmpty(pTStack_20,srcLevel._4_4_);
      if (bVar1) {
        bVar1 = isLevelEmpty(this,srcLevel._4_4_);
        if (!bVar1) {
          clearLevel(this,srcLevel._4_4_);
        }
      }
      else {
        local_30 = getLevel(pTStack_20,srcLevel._4_4_);
        other_00 = std::
                   vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                   ::operator[](&pTStack_20->m_data,(long)srcLevel._4_4_);
        pvVar4 = std::
                 vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                 ::operator[](&this->m_data,(long)srcLevel._4_4_);
        de::ArrayBuffer<unsigned_char,_1UL,_1UL>::operator=(pvVar4,other_00);
        format = ConstPixelBufferAccess::getFormat(local_30);
        iVar2 = ConstPixelBufferAccess::getWidth(local_30);
        iVar3 = ConstPixelBufferAccess::getHeight(local_30);
        depth = ConstPixelBufferAccess::getDepth(local_30);
        pvVar4 = std::
                 vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                 ::operator[](&this->m_data,(long)srcLevel._4_4_);
        data = de::ArrayBuffer<unsigned_char,_1UL,_1UL>::getPtr(pvVar4);
        PixelBufferAccess::PixelBufferAccess(&local_58,format,iVar2,iVar3,depth,data);
        __dest = std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::
                 operator[](&this->m_access,(long)srcLevel._4_4_);
        memcpy(__dest,&local_58,0x28);
      }
    }
  }
  return this;
}

Assistant:

TextureLevelPyramid& TextureLevelPyramid::operator= (const TextureLevelPyramid& other)
{
	if (this == &other)
		return *this;

	m_format = other.m_format;
	m_data.resize(other.getNumLevels());
	m_access.resize(other.getNumLevels());

	for (int levelNdx = 0; levelNdx < other.getNumLevels(); levelNdx++)
	{
		if (!other.isLevelEmpty(levelNdx))
		{
			const tcu::ConstPixelBufferAccess& srcLevel = other.getLevel(levelNdx);

			m_data[levelNdx] = other.m_data[levelNdx];
			m_access[levelNdx] = PixelBufferAccess(srcLevel.getFormat(), srcLevel.getWidth(), srcLevel.getHeight(), srcLevel.getDepth(), m_data[levelNdx].getPtr());
		}
		else if (!isLevelEmpty(levelNdx))
			clearLevel(levelNdx);
	}

	return *this;
}